

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
* __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Clone
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)operator_new(0x50);
  IteratorImpl(this_00,this);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  ;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }